

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O3

adios2_attribute *
adios2_inquire_variable_attribute(adios2_io *io,char *name,char *variable_name,char *separator)

{
  ulong *puVar1;
  char *pcVar2;
  undefined8 *puVar3;
  adios2_attribute *paVar4;
  ulong uVar5;
  string globalName;
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  undefined8 uStack_a0;
  char *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  ulong *local_38;
  long local_30;
  ulong local_28 [2];
  
  std::__cxx11::string::string((string *)&local_38,variable_name,&local_b9);
  std::__cxx11::string::string((string *)&local_58,separator,&local_ba);
  uVar5 = 0xf;
  if (local_38 != local_28) {
    uVar5 = local_28[0];
  }
  if (uVar5 < (ulong)(local_50 + local_30)) {
    uVar5 = 0xf;
    if (local_58 != local_48) {
      uVar5 = local_48[0];
    }
    if (uVar5 < (ulong)(local_50 + local_30)) goto LAB_0011a46f;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38);
  }
  else {
LAB_0011a46f:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58);
  }
  local_b8 = &local_a8;
  puVar1 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar1) {
    local_a8 = *puVar1;
    uStack_a0 = puVar3[3];
  }
  else {
    local_a8 = *puVar1;
    local_b8 = (ulong *)*puVar3;
  }
  local_b0 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::string((string *)&local_78,name,&local_bb);
  uVar5 = 0xf;
  if (local_b8 != &local_a8) {
    uVar5 = local_a8;
  }
  if (uVar5 < (ulong)(local_70 + local_b0)) {
    uVar5 = 0xf;
    if (local_78 != local_68) {
      uVar5 = local_68[0];
    }
    if ((ulong)(local_70 + local_b0) <= uVar5) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_b8);
      goto LAB_0011a547;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_78);
LAB_0011a547:
  local_98 = (char *)&local_88;
  pcVar2 = (char *)(puVar3 + 2);
  if ((char *)*puVar3 == pcVar2) {
    local_88 = *(undefined8 *)pcVar2;
    uStack_80 = puVar3[3];
  }
  else {
    local_88 = *(undefined8 *)pcVar2;
    local_98 = (char *)*puVar3;
  }
  local_90 = puVar3[1];
  *puVar3 = pcVar2;
  puVar3[1] = 0;
  *pcVar2 = '\0';
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  paVar4 = adios2_inquire_attribute(io,local_98);
  if (local_98 != (char *)&local_88) {
    operator_delete(local_98);
  }
  return paVar4;
}

Assistant:

adios2_attribute *adios2_inquire_variable_attribute(adios2_io *io, const char *name,
                                                    const char *variable_name,
                                                    const char *separator)
{
    // TODO check const char* are not null
    const std::string globalName =
        std::string(variable_name) + std::string(separator) + std::string(name);
    return adios2_inquire_attribute(io, globalName.c_str());
}